

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O0

GENERAL_NAME *
v2i_GENERAL_NAME_ex(GENERAL_NAME *out,X509V3_EXT_METHOD *method,X509V3_CTX *ctx,CONF_VALUE *cnf,
                   int is_nc)

{
  char *name_00;
  char *value_00;
  int iVar1;
  int local_4c;
  int type;
  char *value;
  char *name;
  int is_nc_local;
  CONF_VALUE *cnf_local;
  X509V3_CTX *ctx_local;
  X509V3_EXT_METHOD *method_local;
  GENERAL_NAME *out_local;
  
  name_00 = cnf->name;
  value_00 = cnf->value;
  if (value_00 == (char *)0x0) {
    ERR_put_error(0x14,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                  ,0x1f5);
    out_local = (GENERAL_NAME *)0x0;
  }
  else {
    iVar1 = x509v3_conf_name_matches(name_00,"email");
    if (iVar1 == 0) {
      iVar1 = x509v3_conf_name_matches(name_00,"URI");
      if (iVar1 == 0) {
        iVar1 = x509v3_conf_name_matches(name_00,"DNS");
        if (iVar1 == 0) {
          iVar1 = x509v3_conf_name_matches(name_00,"RID");
          if (iVar1 == 0) {
            iVar1 = x509v3_conf_name_matches(name_00,"IP");
            if (iVar1 == 0) {
              iVar1 = x509v3_conf_name_matches(name_00,"dirName");
              if (iVar1 == 0) {
                iVar1 = x509v3_conf_name_matches(name_00,"otherName");
                if (iVar1 == 0) {
                  ERR_put_error(0x14,0,0xa0,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                                ,0x209);
                  ERR_add_error_data(2,"name=",name_00);
                  return (GENERAL_NAME *)0x0;
                }
                local_4c = 0;
              }
              else {
                local_4c = 4;
              }
            }
            else {
              local_4c = 7;
            }
          }
          else {
            local_4c = 8;
          }
        }
        else {
          local_4c = 2;
        }
      }
      else {
        local_4c = 6;
      }
    }
    else {
      local_4c = 1;
    }
    out_local = (GENERAL_NAME *)a2i_GENERAL_NAME(out,method,ctx,local_4c,value_00,is_nc);
  }
  return (GENERAL_NAME *)out_local;
}

Assistant:

GENERAL_NAME *v2i_GENERAL_NAME_ex(GENERAL_NAME *out,
                                  const X509V3_EXT_METHOD *method,
                                  const X509V3_CTX *ctx, const CONF_VALUE *cnf,
                                  int is_nc) {
  const char *name = cnf->name;
  const char *value = cnf->value;
  if (!value) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_MISSING_VALUE);
    return NULL;
  }

  int type;
  if (x509v3_conf_name_matches(name, "email")) {
    type = GEN_EMAIL;
  } else if (x509v3_conf_name_matches(name, "URI")) {
    type = GEN_URI;
  } else if (x509v3_conf_name_matches(name, "DNS")) {
    type = GEN_DNS;
  } else if (x509v3_conf_name_matches(name, "RID")) {
    type = GEN_RID;
  } else if (x509v3_conf_name_matches(name, "IP")) {
    type = GEN_IPADD;
  } else if (x509v3_conf_name_matches(name, "dirName")) {
    type = GEN_DIRNAME;
  } else if (x509v3_conf_name_matches(name, "otherName")) {
    type = GEN_OTHERNAME;
  } else {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNSUPPORTED_OPTION);
    ERR_add_error_data(2, "name=", name);
    return NULL;
  }

  return a2i_GENERAL_NAME(out, method, ctx, type, value, is_nc);
}